

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_move_from_ccr(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 pTVar2;
  
  pTVar1 = s->uc->tcg_ctx;
  pTVar2 = gen_get_ccr(s);
  pTVar2 = gen_ea(env,s,insn,1,pTVar2,(TCGv_i32 *)0x0,EA_STORE,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar2 != pTVar1->NULL_QREG) {
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(move_from_ccr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv ccr;

    ccr = gen_get_ccr(s);
    DEST_EA(env, insn, OS_WORD, ccr, NULL);
}